

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O1

ChVector<double> * __thiscall
chrono::fea::ChElementShellReissner4::EvaluateGP
          (ChVector<double> *__return_storage_ptr__,ChElementShellReissner4 *this,int igp)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  pointer psVar14;
  element_type *peVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  long lVar20;
  
  psVar14 = (this->m_nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar15 = (psVar14->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  this_00 = (psVar14->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  lVar20 = (long)igp;
  pdVar1 = (double *)(&xi_i + lVar20 * 2);
  dVar16 = ((double)(&xi_i)[lVar20 * 2] + 1.0) * 0.25 * ((double)(&DAT_00b92d68)[lVar20 * 2] + 1.0);
  dVar2 = *(double *)((long)&peVar15->super_ChNodeFEAbase + 0x20);
  dVar3 = *(double *)&peVar15->field_0x28;
  dVar4 = *(double *)&peVar15->field_0x30;
  psVar14 = (this->m_nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar15 = psVar14[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  this_01 = psVar14[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  dVar17 = (1.0 - *pdVar1) * 0.25 * ((double)(&DAT_00b92d68)[lVar20 * 2] + 1.0);
  dVar5 = *(double *)((long)&peVar15->super_ChNodeFEAbase + 0x20);
  dVar6 = *(double *)&peVar15->field_0x28;
  dVar7 = *(double *)&peVar15->field_0x30;
  psVar14 = (this->m_nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar15 = psVar14[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  this_02 = psVar14[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_02->_M_use_count = this_02->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_02->_M_use_count = this_02->_M_use_count + 1;
    }
  }
  dVar18 = (1.0 - *pdVar1) * 0.25 * (1.0 - (double)(&DAT_00b92d68)[lVar20 * 2]);
  dVar8 = *(double *)((long)&peVar15->super_ChNodeFEAbase + 0x20);
  dVar9 = *(double *)&peVar15->field_0x28;
  dVar10 = *(double *)&peVar15->field_0x30;
  psVar14 = (this->m_nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar15 = psVar14[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  this_03 = psVar14[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_03->_M_use_count = this_03->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_03->_M_use_count = this_03->_M_use_count + 1;
    }
  }
  dVar19 = (*pdVar1 + 1.0) * 0.25 * (1.0 - (double)(&DAT_00b92d68)[lVar20 * 2]);
  dVar11 = *(double *)((long)&peVar15->super_ChNodeFEAbase + 0x20);
  dVar12 = *(double *)&peVar15->field_0x28;
  dVar13 = *(double *)&peVar15->field_0x30;
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[0] =
       dVar16 * dVar2 + dVar17 * dVar5 + dVar18 * dVar8 + dVar19 * dVar11;
  __return_storage_ptr__->m_data[1] =
       dVar16 * dVar3 + dVar17 * dVar6 + dVar18 * dVar9 + dVar19 * dVar12;
  __return_storage_ptr__->m_data[2] =
       dVar16 * dVar4 + dVar17 * dVar7 + dVar18 * dVar10 + dVar19 * dVar13;
  if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
  }
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChElementShellReissner4::EvaluateGP(int igp) {
    return GetNodeA()->GetPos() * L1(xi_i[igp]) + GetNodeB()->GetPos() * L2(xi_i[igp]) +
           GetNodeC()->GetPos() * L3(xi_i[igp]) + GetNodeD()->GetPos() * L4(xi_i[igp]);
}